

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void ArrayClear(array *a)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = a->_Begin;
  if (pcVar1 != (char *)0x0) {
    uVar2 = *(ulong *)(pcVar1 + -0x10);
    if ((long)uVar2 < 0) {
      if ((uVar2 & 0x3fffffffffffffff) != 0) {
        (**(code **)(uVar2 + 8))(uVar2,pcVar1 + -0x10,(uVar2 & 0x3fffffffffffffff) + 0x10);
      }
      if (-1 < *(long *)(uVar2 + 0x28)) {
        __assert_fail("Heap->Size & DATA_FLAG_MEMHEAP",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x85,"void ArrayInitEx(array *, const cc_memheap *)");
      }
      a->_Begin = (char *)(uVar2 + 0x30);
      a->_Used = 0;
    }
    else {
      if (0x3fffffffffffffff < uVar2) {
        free(pcVar1 + -0x10);
      }
      a->_Begin = (char *)0x0;
      a->_Used = 0;
    }
  }
  return;
}

Assistant:

NOINLINE void ArrayClear(array* a)
{
    if (!a->_Begin)
        return;
    datahead *hp = Data_Head(a);
    if (Data_IsMemHeap(hp))
    {
        dataheaphead *dp = Data_HeapHead(a);
        const struct cc_memheap* Heap = dp->Heap;
        if (Data_GetSize(hp))
            MemHeap_Free(Heap,dp,Data_GetSize(hp)+sizeof(dataheaphead));
        ArrayInitEx(a, Heap);
    }
    else if (Data_IsHeap(hp))
    {
        free(hp);
        a->_Begin = NULL;
        a->_Used = 0;
    }
    else
    {
        a->_Begin = NULL;
        a->_Used = 0;
    }
}